

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O0

StringEntry * __thiscall
cmELFInternalImpl<cmELFTypes64>::GetDynamicSectionString
          (cmELFInternalImpl<cmELFTypes64> *this,uint tag)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  pointer ppVar4;
  cmELFInternalImpl<cmELFTypes64> *this_00;
  reference pvVar5;
  size_type sVar6;
  pointer pbVar7;
  long *plVar8;
  type pbVar9;
  ulong uVar10;
  difference_type dVar11;
  __normal_iterator<Elf64_Dyn_*,_std::vector<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>_> local_98;
  char local_8a;
  byte local_89;
  undefined1 auStack_88 [6];
  char c;
  bool terminated;
  __mbstate_t local_80;
  unsigned_long local_78;
  unsigned_long end;
  unsigned_long last;
  unsigned_long first;
  ELF_Dyn *dyn;
  __normal_iterator<Elf64_Dyn_*,_std::vector<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>_> local_50;
  iterator di;
  ELF_Shdr *strtab;
  ELF_Shdr *sec;
  StringEntry *se;
  _Self local_28;
  iterator dssi;
  uint tag_local;
  cmELFInternalImpl<cmELFTypes64> *this_local;
  
  dssi._M_node._4_4_ = tag;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_cmELF::StringEntry,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cmELF::StringEntry>_>_>
       ::find(&(this->super_cmELFInternal).DynamicSectionStrings,
              (key_type_conflict1 *)((long)&dssi._M_node + 4));
  se = (StringEntry *)
       std::
       map<unsigned_int,_cmELF::StringEntry,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cmELF::StringEntry>_>_>
       ::end(&(this->super_cmELFInternal).DynamicSectionStrings);
  bVar2 = std::operator!=(&local_28,(_Self *)&se);
  if (bVar2) {
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_cmELF::StringEntry>_>::operator->
                       (&local_28);
    if ((ppVar4->second).Position == 0) {
      this_local = (cmELFInternalImpl<cmELFTypes64> *)0x0;
    }
    else {
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_cmELF::StringEntry>_>::
               operator->(&local_28);
      this_local = (cmELFInternalImpl<cmELFTypes64> *)&ppVar4->second;
    }
  }
  else {
    this_00 = (cmELFInternalImpl<cmELFTypes64> *)
              std::
              map<unsigned_int,_cmELF::StringEntry,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cmELF::StringEntry>_>_>
              ::operator[](&(this->super_cmELFInternal).DynamicSectionStrings,
                           (key_type_conflict1 *)((long)&dssi._M_node + 4));
    *(unsigned_long *)&(this_00->super_cmELFInternal).Machine = 0;
    *(unsigned_long *)&(this_00->super_cmELFInternal).DynamicSectionStrings._M_t._M_impl = 0;
    (this_00->super_cmELFInternal).DynamicSectionStrings._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_color = ~_S_red;
    bVar2 = LoadDynamicSection(this);
    if (bVar2) {
      pvVar5 = std::vector<Elf64_Shdr,_std::allocator<Elf64_Shdr>_>::operator[]
                         (&this->SectionHeaders,
                          (long)(this->super_cmELFInternal).DynamicSectionIndex);
      uVar1 = pvVar5->sh_link;
      sVar6 = std::vector<Elf64_Shdr,_std::allocator<Elf64_Shdr>_>::size(&this->SectionHeaders);
      if (uVar1 < sVar6) {
        di._M_current =
             (anon_struct_16_2_e86ad9ac *)
             std::vector<Elf64_Shdr,_std::allocator<Elf64_Shdr>_>::operator[]
                       (&this->SectionHeaders,(ulong)pvVar5->sh_link);
        local_50._M_current =
             (anon_struct_16_2_e86ad9ac *)
             std::vector<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>::begin(&this->DynamicSectionEntries)
        ;
        while( true ) {
          dyn = (ELF_Dyn *)
                std::vector<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>::end
                          (&this->DynamicSectionEntries);
          bVar2 = __gnu_cxx::operator!=
                            (&local_50,
                             (__normal_iterator<Elf64_Dyn_*,_std::vector<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>_>
                              *)&dyn);
          if (!bVar2) break;
          first = (unsigned_long)
                  __gnu_cxx::
                  __normal_iterator<Elf64_Dyn_*,_std::vector<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>_>
                  ::operator*(&local_50);
          if (((reference)first)->d_tag == (ulong)dssi._M_node._4_4_) {
            if ((ulong)di._M_current[2].d_tag <= (((reference)first)->d_un).d_val) {
              cmELFInternal::SetErrorMessage
                        (&this->super_cmELFInternal,
                         "Section DYNAMIC references string beyond the end of its string section.");
              return (StringEntry *)(cmELFInternalImpl<cmELFTypes64> *)0x0;
            }
            end = (((reference)first)->d_un).d_val;
            local_78 = di._M_current[2].d_tag;
            last = end;
            pbVar7 = std::
                     unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                     ::operator->(&(this->super_cmELFInternal).Stream);
            std::fpos<__mbstate_t>::fpos
                      ((fpos<__mbstate_t> *)auStack_88,di._M_current[1].d_un.d_val + last);
            std::istream::seekg(pbVar7,_auStack_88,local_80);
            local_89 = 0;
            while( true ) {
              bVar2 = false;
              if (end != local_78) {
                pbVar7 = std::
                         unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                         ::operator->(&(this->super_cmELFInternal).Stream);
                plVar8 = (long *)std::istream::get((char *)pbVar7);
                bVar3 = std::ios::operator_cast_to_bool
                                  ((ios *)((long)plVar8 + *(long *)(*plVar8 + -0x18)));
                bVar2 = false;
                if (bVar3) {
                  bVar2 = (local_89 & 1) == 0 || local_8a == '\0';
                }
              }
              if (!bVar2) break;
              end = end + 1;
              if (local_8a == '\0') {
                local_89 = 1;
              }
              else {
                std::__cxx11::string::operator+=((string *)this_00,local_8a);
              }
            }
            pbVar9 = std::
                     unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                     ::operator*(&(this->super_cmELFInternal).Stream);
            uVar10 = std::ios::operator!((ios *)(pbVar9 + *(long *)(*(long *)pbVar9 + -0x18)));
            if ((uVar10 & 1) == 0) {
              *(Elf64_Xword *)&(this_00->super_cmELFInternal).Machine =
                   di._M_current[1].d_un.d_val + last;
              *(unsigned_long *)&(this_00->super_cmELFInternal).DynamicSectionStrings._M_t._M_impl =
                   end - last;
              local_98._M_current =
                   (anon_struct_16_2_e86ad9ac *)
                   std::vector<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>::begin
                             (&this->DynamicSectionEntries);
              dVar11 = __gnu_cxx::operator-(&local_50,&local_98);
              (this_00->super_cmELFInternal).DynamicSectionStrings._M_t._M_impl.
              super__Rb_tree_header._M_header._M_color = (_Rb_tree_color)dVar11;
              return (StringEntry *)this_00;
            }
            cmELFInternal::SetErrorMessage
                      (&this->super_cmELFInternal,"Dynamic section specifies unreadable RPATH.");
            std::__cxx11::string::operator=((string *)this_00,"");
            return (StringEntry *)(cmELFInternalImpl<cmELFTypes64> *)0x0;
          }
          __gnu_cxx::
          __normal_iterator<Elf64_Dyn_*,_std::vector<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>_>::
          operator++(&local_50);
        }
        this_local = (cmELFInternalImpl<cmELFTypes64> *)0x0;
      }
      else {
        cmELFInternal::SetErrorMessage
                  (&this->super_cmELFInternal,"Section DYNAMIC has invalid string table index.");
        this_local = (cmELFInternalImpl<cmELFTypes64> *)0x0;
      }
    }
    else {
      this_local = (cmELFInternalImpl<cmELFTypes64> *)0x0;
    }
  }
  return (StringEntry *)this_local;
}

Assistant:

cmELF::StringEntry const* cmELFInternalImpl<Types>::GetDynamicSectionString(
  unsigned int tag)
{
  // Short-circuit if already checked.
  auto dssi = this->DynamicSectionStrings.find(tag);
  if (dssi != this->DynamicSectionStrings.end()) {
    if (dssi->second.Position > 0) {
      return &dssi->second;
    }
    return nullptr;
  }

  // Create an entry for this tag.  Assume it is missing until found.
  StringEntry& se = this->DynamicSectionStrings[tag];
  se.Position = 0;
  se.Size = 0;
  se.IndexInSection = -1;

  // Try reading the dynamic section.
  if (!this->LoadDynamicSection()) {
    return nullptr;
  }

  // Get the string table referenced by the DYNAMIC section.
  ELF_Shdr const& sec = this->SectionHeaders[this->DynamicSectionIndex];
  if (sec.sh_link >= this->SectionHeaders.size()) {
    this->SetErrorMessage("Section DYNAMIC has invalid string table index.");
    return nullptr;
  }
  ELF_Shdr const& strtab = this->SectionHeaders[sec.sh_link];

  // Look for the requested entry.
  for (auto di = this->DynamicSectionEntries.begin();
       di != this->DynamicSectionEntries.end(); ++di) {
    ELF_Dyn& dyn = *di;
    if (static_cast<tagtype>(dyn.d_tag) == static_cast<tagtype>(tag)) {
      // We found the tag requested.
      // Make sure the position given is within the string section.
      if (dyn.d_un.d_val >= strtab.sh_size) {
        this->SetErrorMessage("Section DYNAMIC references string beyond "
                              "the end of its string section.");
        return nullptr;
      }

      // Seek to the position reported by the entry.
      unsigned long first = static_cast<unsigned long>(dyn.d_un.d_val);
      unsigned long last = first;
      unsigned long end = static_cast<unsigned long>(strtab.sh_size);
      this->Stream->seekg(strtab.sh_offset + first);

      // Read the string.  It may be followed by more than one NULL
      // terminator.  Count the total size of the region allocated to
      // the string.  This assumes that the next string in the table
      // is non-empty, but the "chrpath" tool makes the same
      // assumption.
      bool terminated = false;
      char c;
      while (last != end && this->Stream->get(c) && !(terminated && c)) {
        ++last;
        if (c) {
          se.Value += c;
        } else {
          terminated = true;
        }
      }

      // Make sure the whole value was read.
      if (!(*this->Stream)) {
        this->SetErrorMessage("Dynamic section specifies unreadable RPATH.");
        se.Value = "";
        return nullptr;
      }

      // The value has been read successfully.  Report it.
      se.Position = static_cast<unsigned long>(strtab.sh_offset + first);
      se.Size = last - first;
      se.IndexInSection =
        static_cast<int>(di - this->DynamicSectionEntries.begin());
      return &se;
    }
  }
  return nullptr;
}